

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uv_handle_type uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  long unaff_R15;
  anon_union_64_2_d657c519 scratch;
  msghdr msg;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  msghdr local_68;
  
  uVar3 = uv__getiovmax();
  if ((int)uVar3 < (int)nbufs) {
    nbufs = uVar3;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      iVar2 = (stream->io_watcher).fd;
      if (nbufs == 1) {
        unaff_R15 = write(iVar2,bufs->base,bufs->len);
      }
      else {
        unaff_R15 = writev(iVar2,(iovec *)bufs,nbufs);
      }
      if (unaff_R15 != -1) goto LAB_002549d0;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    unaff_R15 = -1;
    goto LAB_002549d0;
  }
  uVar3 = send_handle->flags;
  if ((uVar3 & 3) == 0) {
    uVar1 = send_handle->type;
    lVar5 = 0xb8;
    if ((uVar1 == UV_NAMED_PIPE) || (uVar1 == UV_TCP)) {
LAB_002548f0:
      uVar4 = *(uint *)((long)send_handle->handle_queue + lVar5 + -0x20);
    }
    else {
      uVar4 = 0xffffffff;
      if (uVar1 == UV_UDP) {
        lVar5 = 0xb0;
        goto LAB_002548f0;
      }
    }
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    if ((int)uVar4 < 0) {
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x33c,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    local_68.msg_name = (void *)0x0;
    local_68.msg_namelen = 0;
    local_68.msg_iovlen = (size_t)(int)nbufs;
    local_68.msg_flags = 0;
    local_68.msg_controllen = 0x18;
    uStack_a0 = 0x100000001;
    local_a8 = 0x14;
    local_98 = (ulong)uVar4;
    local_68.msg_iov = (iovec *)bufs;
    local_68.msg_control = &local_a8;
    do {
      unaff_R15 = sendmsg((stream->io_watcher).fd,&local_68,0);
      if (unaff_R15 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
  }
  if ((uVar3 & 3) != 0) {
    return -9;
  }
LAB_002549d0:
  if (unaff_R15 < 0) {
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    iVar7 = -0xb;
    if ((iVar2 != 0xb) && (iVar2 != 0x69)) {
      iVar7 = -iVar2;
    }
  }
  else {
    iVar7 = (int)unaff_R15;
  }
  return iVar7;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && errno == EINTR);
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && errno == EINTR);
  }

  if (n >= 0)
    return n;

  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
    return UV_EAGAIN;

#ifdef __APPLE__
  /* macOS versions 10.10 and 10.15 - and presumbaly 10.11 to 10.14, too -
   * have a bug where a race condition causes the kernel to return EPROTOTYPE
   * because the socket isn't fully constructed. It's probably the result of
   * the peer closing the connection and that is why libuv translates it to
   * ECONNRESET. Previously, libuv retried until the EPROTOTYPE error went
   * away but some VPN software causes the same behavior except the error is
   * permanent, not transient, turning the retry mechanism into an infinite
   * loop. See https://github.com/libuv/libuv/pull/482.
   */
  if (errno == EPROTOTYPE)
    return UV_ECONNRESET;
#endif  /* __APPLE__ */

  return UV__ERR(errno);
}